

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

Gia_Obj_t * Gia_ManFraigMarkAnd(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0xf7,"Gia_Obj_t *Gia_ManFraigMarkAnd(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar6 = *(ulong *)pObj & 0x1fffffff;
  if (uVar6 != 0x1fffffff && -1 < (int)*(ulong *)pObj) {
    pGVar1 = p->pObjs;
    lVar3 = (long)pObj - (long)pGVar1;
    do {
      if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
LAB_0022d9f4:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar4 = (int)(lVar3 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar4) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      piVar2 = p->pTravIds;
      if (piVar2[iVar4] == p->nTravIds) {
        if ((pObj + -uVar6 < pGVar1) || (pGVar1 + p->nObjs <= pObj + -uVar6)) goto LAB_0022d9f4;
        iVar4 = (int)((long)(lVar3 + uVar6 * -0xc) >> 2) * -0x55555555;
        if (p->nTravIdsAlloc <= iVar4) {
LAB_0022da13:
          __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
        }
        piVar2[iVar4] = p->nTravIds;
        uVar5 = *(uint *)&pObj->field_0x4 & 0x1fffffff;
        pGVar7 = (Gia_Obj_t *)((long)pObj + (ulong)(uVar5 * 4) * -3);
        if ((pGVar7 < pGVar1) || (pGVar1 + p->nObjs <= pGVar7)) goto LAB_0022d9f4;
        iVar4 = (int)((long)(lVar3 + (ulong)(uVar5 << 2) * -3) >> 2) * -0x55555555;
        if (p->nTravIdsAlloc <= iVar4) goto LAB_0022da13;
        piVar2[iVar4] = p->nTravIds;
      }
      pGVar7 = pObj + -1;
      pObj = pObj + -1;
      if ((int)(uint)*(undefined8 *)pGVar7 < 0) {
        return pObj;
      }
      uVar5 = (uint)*(undefined8 *)pGVar7 & 0x1fffffff;
      uVar6 = (ulong)uVar5;
      lVar3 = lVar3 + -0xc;
    } while (uVar5 != 0x1fffffff);
  }
  return pObj;
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkAnd( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    for ( assert( Gia_ObjIsAnd(pObj) ); Gia_ObjIsAnd(pObj); pObj-- )
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        {
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin1(pObj) );
        }
    return pObj;
}